

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O0

int nn_xrep_add(nn_sockbase *self,nn_pipe *pipe)

{
  nn_xrep_data *local_40;
  size_t local_38;
  size_t sz;
  undefined8 *puStack_28;
  int rcvprio;
  nn_xrep_data *data;
  nn_xrep *xrep;
  nn_pipe *pipe_local;
  nn_sockbase *self_local;
  
  local_40 = (nn_xrep_data *)self;
  if (self == (nn_sockbase *)0x0) {
    local_40 = (nn_xrep_data *)0x0;
  }
  data = local_40;
  local_38 = 4;
  xrep = (nn_xrep *)pipe;
  pipe_local = (nn_pipe *)self;
  nn_pipe_getopt(pipe,0,9,(void *)((long)&sz + 4),&local_38);
  if (local_38 != 4) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (rcvprio)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/reqrep/xrep.c"
            ,99);
    fflush(_stderr);
    nn_err_abort();
  }
  if (sz._4_4_ < 1 || 0x10 < sz._4_4_) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rcvprio >= 1 && rcvprio <= 16",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/reqrep/xrep.c"
            ,100);
    fflush(_stderr);
    nn_err_abort();
  }
  puStack_28 = (undefined8 *)nn_alloc_(0x48);
  if (puStack_28 == (undefined8 *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/reqrep/xrep.c"
            ,0x67);
    fflush(_stderr);
    nn_err_abort();
  }
  *puStack_28 = xrep;
  nn_hash_item_init((nn_hash_item *)(puStack_28 + 1));
  *(undefined4 *)(puStack_28 + 8) = 0;
  nn_mutex_lock((nn_mutex *)(data + 6));
  nn_hash_insert((nn_hash *)&(data->outitem).list.prev,
                 *(uint *)&(data->outitem).list.next & 0x7fffffff,(nn_hash_item *)(puStack_28 + 1));
  *(int *)&(data->outitem).list.next = *(int *)&(data->outitem).list.next + 1;
  nn_fq_add((nn_fq *)&(data->initem).priodata.priority,(nn_fq_data *)(puStack_28 + 4),
            (nn_pipe *)xrep,sz._4_4_);
  nn_pipe_setdata((nn_pipe *)xrep,puStack_28);
  nn_mutex_unlock((nn_mutex *)(data + 6));
  return 0;
}

Assistant:

int nn_xrep_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xrep *xrep;
    struct nn_xrep_data *data;
    int rcvprio;
    size_t sz;

    xrep = nn_cont (self, struct nn_xrep, sockbase);

    sz = sizeof (rcvprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_RCVPRIO, &rcvprio, &sz);
    nn_assert (sz == sizeof (rcvprio));
    nn_assert (rcvprio >= 1 && rcvprio <= 16);

    data = nn_alloc (sizeof (struct nn_xrep_data), "pipe data (xrep)");
    alloc_assert (data);
    data->pipe = pipe;
    nn_hash_item_init (&data->outitem);
    data->flags = 0;
    nn_mutex_lock(&xrep->sync);
    nn_hash_insert (&xrep->outpipes, xrep->next_key & 0x7fffffff,
        &data->outitem);
    ++xrep->next_key;
    nn_fq_add (&xrep->inpipes, &data->initem, pipe, rcvprio);
    nn_pipe_setdata (pipe, data);
    nn_mutex_unlock(&xrep->sync);

    return 0;
}